

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2enc.c
# Opt level: O0

int jpc_enc_encpkt(jpc_enc_t *enc,jas_stream_t *out,int compno,int lvlno,int prcno,uint lyrno)

{
  uint uVar1;
  uint uVar2;
  jpc_enc_tile_t *pjVar3;
  jpc_enc_cp_t *pjVar4;
  jpc_enc_rlvl_t *pjVar5;
  jpc_enc_band_t *pjVar6;
  jpc_enc_prc_t *pjVar7;
  jpc_enc_cblk_t *pjVar8;
  jpc_enc_pass_t *pjVar9;
  uint_fast16_t uVar10;
  uchar *puVar11;
  jpc_enc_pass_t *pjVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  jpc_ms_t *pjVar18;
  jpc_bitstream_t *bitstream;
  jpc_tagtreenode_t *pjVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  jpc_enc_pass_t *local_140;
  int local_120;
  int local_11c;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  bool local_fa;
  int local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  jpc_ms_t *ms;
  jpc_enc_cp_t *cp;
  jpc_enc_prc_t *prc;
  jpc_enc_tile_t *tile;
  int passcount;
  int numnewpasses;
  int datalen;
  int maxadjust;
  int adjust;
  int t2;
  int t1;
  int n;
  jpc_tagtreenode_t *leaf;
  int ret;
  int included;
  int i;
  jpc_enc_pass_t *endpasses;
  jpc_enc_pass_t *endpass;
  jpc_enc_pass_t *lastpass;
  jpc_enc_pass_t *startpass;
  jpc_enc_pass_t *pass;
  jpc_bitstream_t *outb;
  jpc_enc_cblk_t *endcblks;
  jpc_enc_cblk_t *cblk;
  jpc_enc_band_t *endbands;
  jpc_enc_band_t *band;
  jpc_enc_rlvl_t *lvl;
  jpc_enc_tcmpt_t *comp;
  uint lyrno_local;
  int prcno_local;
  int lvlno_local;
  int compno_local;
  jas_stream_t *out_local;
  jpc_enc_t *enc_local;
  
  iVar13 = jas_getdbglevel();
  if (9 < iVar13) {
    jas_eprintf("encoding packet begin %d %d %d %d\n",(ulong)(uint)compno,(ulong)(uint)lvlno,
                (ulong)(uint)prcno,(ulong)lyrno);
  }
  pjVar3 = enc->curtile;
  pjVar4 = enc->cp;
  if (((pjVar4->tcp).csty & 2) != 0) {
    pjVar18 = jpc_ms_create(0xff91);
    if (pjVar18 == (jpc_ms_t *)0x0) {
      return -1;
    }
    *(long *)&pjVar18->parms = (long)pjVar3->pi->pktno;
    iVar13 = jpc_putms(out,enc->cstate,pjVar18);
    if (iVar13 != 0) {
      return -1;
    }
    jpc_ms_destroy(pjVar18);
  }
  bitstream = jpc_bitstream_sopen(out,"w+");
  if (bitstream == (jpc_bitstream_t *)0x0) {
    abort();
  }
  if ((bitstream->openmode_ & 2U) != 0) {
    iVar13 = bitstream->cnt_ + -1;
    bitstream->cnt_ = iVar13;
    if (iVar13 < 0) {
      bitstream->buf_ = (bitstream->buf_ & 0xff) << 8;
      iVar13 = 7;
      if (bitstream->buf_ == 0xff00) {
        iVar13 = 6;
      }
      bitstream->cnt_ = iVar13;
      bitstream->buf_ = (long)(1 << ((byte)bitstream->cnt_ & 0x1f)) | bitstream->buf_;
      if ((bitstream->stream_->flags_ & 7U) == 0) {
        if ((bitstream->stream_->rwlimit_ < 0) ||
           (bitstream->stream_->rwcnt_ < bitstream->stream_->rwlimit_)) {
          bitstream->stream_->bufmode_ = bitstream->stream_->bufmode_ | 0x20;
          iVar13 = bitstream->stream_->cnt_ + -1;
          bitstream->stream_->cnt_ = iVar13;
          if (iVar13 < 0) {
            local_f0 = jas_stream_flushbuf(bitstream->stream_,(uint)(bitstream->buf_ >> 8) & 0xff);
          }
          else {
            bitstream->stream_->rwcnt_ = bitstream->stream_->rwcnt_ + 1;
            uVar10 = bitstream->buf_;
            puVar11 = bitstream->stream_->ptr_;
            bitstream->stream_->ptr_ = puVar11 + 1;
            *puVar11 = (uchar)(uVar10 >> 8);
            local_f0 = (uint)(uVar10 >> 8) & 0xff;
          }
          local_ec = local_f0;
        }
        else {
          bitstream->stream_->flags_ = bitstream->stream_->flags_ | 4;
          local_ec = 0xffffffff;
        }
        local_f4 = local_ec;
      }
      else {
        local_f4 = 0xffffffff;
      }
      local_f8 = 1;
      if (local_f4 == 0xffffffff) {
        local_f8 = -1;
      }
    }
    else {
      bitstream->buf_ = (long)(1 << ((byte)bitstream->cnt_ & 0x1f)) | bitstream->buf_;
      local_f8 = 1;
    }
    if (local_f8 == -1) {
      return -1;
    }
    iVar13 = jas_getdbglevel();
    if (9 < iVar13) {
      jas_eprintf("present.\n");
    }
    pjVar5 = pjVar3->tcmpts[compno].rlvls;
    pjVar6 = pjVar5[lvlno].bands;
    uVar1 = pjVar5[lvlno].numbands;
    for (endbands = pjVar5[lvlno].bands; endbands != pjVar6 + uVar1; endbands = endbands + 1) {
      if ((endbands->data != (jas_matrix_t *)0x0) &&
         (pjVar7 = endbands->prcs, pjVar7[prcno].cblks != (jpc_enc_cblk_t *)0x0)) {
        pjVar8 = pjVar7[prcno].cblks;
        uVar2 = pjVar7[prcno].numcblks;
        for (endcblks = pjVar7[prcno].cblks; endcblks != pjVar8 + uVar2; endcblks = endcblks + 1) {
          if (lyrno == 0) {
            pjVar19 = jpc_tagtree_getleaf(pjVar7[prcno].nlibtree,
                                          (int)(((long)endcblks - (long)pjVar7[prcno].cblks) / 0x68)
                                         );
            jpc_tagtree_setvalue(pjVar7[prcno].nlibtree,pjVar19,endcblks->numimsbs);
          }
          pjVar9 = endcblks->curpass;
          bVar22 = false;
          if (pjVar9 != (jpc_enc_pass_t *)0x0) {
            bVar22 = pjVar9->lyrno == lyrno;
          }
          if ((bVar22) && (endcblks->numencpasses == 0)) {
            if (pjVar9->lyrno != lyrno) {
              __assert_fail("pass->lyrno == lyrno",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                            ,0xee,
                            "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                           );
            }
            pjVar19 = jpc_tagtree_getleaf(pjVar7[prcno].incltree,
                                          (int)(((long)endcblks - (long)pjVar7[prcno].cblks) / 0x68)
                                         );
            jpc_tagtree_setvalue(pjVar7[prcno].incltree,pjVar19,pjVar9->lyrno);
          }
        }
        pjVar8 = pjVar7[prcno].cblks;
        uVar2 = pjVar7[prcno].numcblks;
        for (endcblks = pjVar7[prcno].cblks; endcblks != pjVar8 + uVar2; endcblks = endcblks + 1) {
          pjVar9 = endcblks->curpass;
          local_fa = false;
          if (pjVar9 != (jpc_enc_pass_t *)0x0) {
            local_fa = pjVar9->lyrno == lyrno;
          }
          uVar14 = (uint)local_fa;
          if (endcblks->numencpasses == 0) {
            pjVar19 = jpc_tagtree_getleaf(pjVar7[prcno].incltree,
                                          (int)(((long)endcblks - (long)pjVar7[prcno].cblks) / 0x68)
                                         );
            iVar13 = jpc_tagtree_encode(pjVar7[prcno].incltree,pjVar19,lyrno + 1,bitstream);
            if (iVar13 < 0) {
              return -1;
            }
          }
          else {
            if ((bitstream->openmode_ & 2U) == 0) {
              __assert_fail("(outb)->openmode_ & JPC_BITSTREAM_WRITE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                            ,0x101,
                            "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                           );
            }
            iVar13 = bitstream->cnt_ + -1;
            bitstream->cnt_ = iVar13;
            if (iVar13 < 0) {
              bitstream->buf_ = (bitstream->buf_ & 0xff) << 8;
              iVar13 = 7;
              if (bitstream->buf_ == 0xff00) {
                iVar13 = 6;
              }
              bitstream->cnt_ = iVar13;
              bitstream->buf_ =
                   (long)(int)(uVar14 << ((byte)bitstream->cnt_ & 0x1f)) | bitstream->buf_;
              if ((bitstream->stream_->flags_ & 7U) == 0) {
                if ((bitstream->stream_->rwlimit_ < 0) ||
                   (bitstream->stream_->rwcnt_ < bitstream->stream_->rwlimit_)) {
                  bitstream->stream_->bufmode_ = bitstream->stream_->bufmode_ | 0x20;
                  iVar13 = bitstream->stream_->cnt_ + -1;
                  bitstream->stream_->cnt_ = iVar13;
                  if (iVar13 < 0) {
                    local_104 = jas_stream_flushbuf(bitstream->stream_,
                                                    (uint)(bitstream->buf_ >> 8) & 0xff);
                  }
                  else {
                    bitstream->stream_->rwcnt_ = bitstream->stream_->rwcnt_ + 1;
                    uVar10 = bitstream->buf_;
                    puVar11 = bitstream->stream_->ptr_;
                    bitstream->stream_->ptr_ = puVar11 + 1;
                    *puVar11 = (uchar)(uVar10 >> 8);
                    local_104 = (uint)(uVar10 >> 8) & 0xff;
                  }
                  local_100 = local_104;
                }
                else {
                  bitstream->stream_->flags_ = bitstream->stream_->flags_ | 4;
                  local_100 = 0xffffffff;
                }
                local_108 = local_100;
              }
              else {
                local_108 = 0xffffffff;
              }
              local_10c = uVar14;
              if (local_108 == 0xffffffff) {
                local_10c = 0xffffffff;
              }
              local_110 = local_10c;
            }
            else {
              bitstream->buf_ =
                   (long)(int)(uVar14 << ((byte)bitstream->cnt_ & 0x1f)) | bitstream->buf_;
              local_110 = uVar14;
            }
            if (local_110 == 0xffffffff) {
              return -1;
            }
          }
          iVar13 = jas_getdbglevel();
          if (9 < iVar13) {
            jas_eprintf("included=%d ");
          }
          if (uVar14 != 0) {
            if (endcblks->numencpasses == 0) {
              ret = 1;
              pjVar19 = jpc_tagtree_getleaf(pjVar7[prcno].nlibtree,
                                            (int)(((long)endcblks - (long)pjVar7[prcno].cblks) /
                                                 0x68));
              while( true ) {
                iVar13 = jpc_tagtree_encode(pjVar7[prcno].nlibtree,pjVar19,ret,bitstream);
                if (iVar13 < 0) {
                  return -1;
                }
                if (iVar13 != 0) break;
                ret = ret + 1;
              }
              if ((pjVar19->known_ == 0) || (ret != pjVar19->value_ + 1)) {
                __assert_fail("leaf->known_ && i == leaf->value_ + 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                              ,0x116,
                              "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                             );
              }
            }
            endpasses = pjVar9;
            while( true ) {
              bVar22 = false;
              if (endpasses != endcblks->passes + endcblks->numpasses) {
                bVar22 = endpasses->lyrno == lyrno;
              }
              if (!bVar22) break;
              endpasses = endpasses + 1;
            }
            uVar20 = ((long)endpasses - (long)pjVar9) / 0x48;
            iVar13 = jpc_putnumnewpasses(bitstream,(int)uVar20);
            if (iVar13 != 0) {
              return -1;
            }
            iVar13 = jas_getdbglevel();
            if (9 < iVar13) {
              jas_eprintf("numnewpasses=%d ",uVar20 & 0xffffffff);
            }
            t2 = pjVar9->start;
            tile._0_4_ = 1;
            numnewpasses = 0;
            for (startpass = pjVar9; startpass != endpasses; startpass = startpass + 1) {
              if ((startpass->term == 0) && (startpass != endpasses + -1)) {
                tile._0_4_ = (int)tile + 1;
              }
              else {
                iVar13 = startpass->end - t2;
                iVar15 = jpc_int_firstone(iVar13);
                local_11c = endcblks->numlenbits;
                iVar16 = jpc_floorlog2((int)tile);
                local_11c = local_11c + iVar16;
                if ((iVar15 + 1) - local_11c < 1) {
                  local_11c = 0;
                }
                else {
                  local_11c = (iVar15 + 1) - local_11c;
                }
                if (numnewpasses < local_11c) {
                  local_120 = local_11c;
                }
                else {
                  local_120 = numnewpasses;
                }
                numnewpasses = local_120;
                t2 = iVar13 + t2;
                tile._0_4_ = 1;
              }
            }
            iVar13 = jpc_putcommacode(bitstream,numnewpasses);
            if (iVar13 != 0) {
              return -1;
            }
            endcblks->numlenbits = numnewpasses + endcblks->numlenbits;
            t2 = pjVar9->start;
            tile._0_4_ = 1;
            for (startpass = pjVar9; startpass != endpasses; startpass = startpass + 1) {
              if ((startpass->term == 0) && (startpass != endpasses + -1)) {
                tile._0_4_ = (int)tile + 1;
              }
              else {
                iVar15 = startpass->end - t2;
                iVar16 = jpc_int_firstone(iVar15);
                iVar13 = endcblks->numlenbits;
                iVar17 = jpc_floorlog2((int)tile);
                if (iVar13 + iVar17 <= iVar16) {
                  __assert_fail("jpc_int_firstone(datalen) < cblk->numlenbits + jpc_floorlog2(passcount)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                ,0x142,
                                "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                               );
                }
                iVar13 = endcblks->numlenbits;
                iVar16 = jpc_floorlog2((int)tile);
                iVar13 = jpc_bitstream_putbits(bitstream,iVar13 + iVar16,(long)iVar15);
                if (iVar13 == -1) {
                  return -1;
                }
                t2 = iVar15 + t2;
                tile._0_4_ = 1;
              }
            }
          }
        }
      }
    }
    jpc_bitstream_outalign(bitstream,0);
    jpc_bitstream_close(bitstream);
    if (((pjVar4->tcp).csty & 4) != 0) {
      pjVar18 = jpc_ms_create(0xff92);
      if (pjVar18 == (jpc_ms_t *)0x0) {
        return -1;
      }
      iVar13 = jpc_putms(out,enc->cstate,pjVar18);
      if (iVar13 != 0) {
        return -1;
      }
      jpc_ms_destroy(pjVar18);
    }
    pjVar5 = pjVar3->tcmpts[compno].rlvls;
    pjVar6 = pjVar5[lvlno].bands;
    uVar1 = pjVar5[lvlno].numbands;
    endbands = pjVar5[lvlno].bands;
    do {
      if (endbands == pjVar6 + uVar1) {
        iVar13 = jas_getdbglevel();
        if (9 < iVar13) {
          jas_eprintf("encoding packet end\n");
        }
        return 0;
      }
      if ((endbands->data != (jas_matrix_t *)0x0) &&
         (pjVar7 = endbands->prcs, pjVar7[prcno].cblks != (jpc_enc_cblk_t *)0x0)) {
        pjVar8 = pjVar7[prcno].cblks;
        uVar2 = pjVar7[prcno].numcblks;
        for (endcblks = pjVar7[prcno].cblks; endcblks != pjVar8 + uVar2; endcblks = endcblks + 1) {
          pjVar9 = endcblks->curpass;
          if (pjVar9 != (jpc_enc_pass_t *)0x0) {
            if (pjVar9->lyrno == lyrno) {
              pjVar12 = endcblks->passes;
              uVar14 = endcblks->numpasses;
              endpasses = pjVar9;
              while( true ) {
                bVar22 = false;
                if (endpasses != pjVar12 + uVar14) {
                  bVar22 = endpasses->lyrno == lyrno;
                }
                if (!bVar22) break;
                endpasses = endpasses + 1;
              }
              jas_stream_seek(endcblks->stream,(long)pjVar9->start,0);
              lVar21 = jas_stream_tell(endcblks->stream);
              if (lVar21 != pjVar9->start) {
                __assert_fail("jas_stream_tell(cblk->stream) == startpass->start",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                              ,0x17e,
                              "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                             );
              }
              iVar13 = jas_stream_copy(out,endcblks->stream,endpasses[-1].end - pjVar9->start);
              if (iVar13 != 0) {
                return -1;
              }
              if (endpasses == pjVar12 + uVar14) {
                local_140 = (jpc_enc_pass_t *)0x0;
              }
              else {
                local_140 = endpasses;
              }
              endcblks->curpass = local_140;
              endcblks->numencpasses =
                   (int)(((long)endpasses - (long)pjVar9) / 0x48) + endcblks->numencpasses;
            }
            else if (pjVar9->lyrno <= lyrno) {
              __assert_fail("pass->lyrno > lyrno",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                            ,0x170,
                            "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                           );
            }
          }
        }
      }
      endbands = endbands + 1;
    } while( true );
  }
  __assert_fail("(outb)->openmode_ & JPC_BITSTREAM_WRITE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                ,0xd3,"int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
               );
}

Assistant:

int jpc_enc_encpkt(jpc_enc_t *enc, jas_stream_t *out, int compno, int lvlno, int prcno, unsigned lyrno)
{
	jpc_enc_tcmpt_t *comp;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_bitstream_t *outb;
	jpc_enc_pass_t *pass;
	jpc_enc_pass_t *startpass;
	jpc_enc_pass_t *lastpass;
	jpc_enc_pass_t *endpass;
	jpc_enc_pass_t *endpasses;
	int i;
	int included;
	int ret;
	jpc_tagtreenode_t *leaf;
	int n;
	int t1;
	int t2;
	int adjust;
	int maxadjust;
	int datalen;
	int numnewpasses;
	int passcount;
	jpc_enc_tile_t *tile;
	jpc_enc_prc_t *prc;
	jpc_enc_cp_t *cp;
	jpc_ms_t *ms;

	JAS_DBGLOG(10, ("encoding packet begin %d %d %d %d\n", compno, lvlno,
	  prcno, lyrno));

	tile = enc->curtile;
	cp = enc->cp;

	if (cp->tcp.csty & JPC_COD_SOP) {
		if (!(ms = jpc_ms_create(JPC_MS_SOP))) {
			return -1;
		}
		ms->parms.sop.seqno = jpc_pi_getind(tile->pi);
		if (jpc_putms(out, enc->cstate, ms)) {
			return -1;
		}
		jpc_ms_destroy(ms);
	}

	if (!(outb = jpc_bitstream_sopen(out, "w+"))) {
		abort();
	}

	if (jpc_bitstream_putbit(outb, 1) == EOF) {
		return -1;
	}
	//JAS_DBGLOG(10, ("\n"));
	JAS_DBGLOG(10, ("present.\n"));

	comp = &tile->tcmpts[compno];
	lvl = &comp->rlvls[lvlno];
	endbands = &lvl->bands[lvl->numbands];
	for (band = lvl->bands; band != endbands; ++band) {
		if (!band->data) {
			continue;
		}
		prc = &band->prcs[prcno];
		if (!prc->cblks) {
			continue;
		}

		endcblks = &prc->cblks[prc->numcblks];
		for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
			if (!lyrno) {
				leaf = jpc_tagtree_getleaf(prc->nlibtree, cblk - prc->cblks);
				jpc_tagtree_setvalue(prc->nlibtree, leaf, cblk->numimsbs);
			}
			pass = cblk->curpass;
			included = (pass && pass->lyrno == lyrno);
			if (included && (!cblk->numencpasses)) {
				assert(pass->lyrno == lyrno);
				leaf = jpc_tagtree_getleaf(prc->incltree,
				  cblk - prc->cblks);
				jpc_tagtree_setvalue(prc->incltree, leaf, pass->lyrno);
			}
		}

		endcblks = &prc->cblks[prc->numcblks];
		for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
			pass = cblk->curpass;
			included = (pass && pass->lyrno == lyrno);
			if (!cblk->numencpasses) {
				leaf = jpc_tagtree_getleaf(prc->incltree,
				  cblk - prc->cblks);
				if (jpc_tagtree_encode(prc->incltree, leaf, lyrno + 1, outb) <
				  0) {
					return -1;
				}
			} else {
				if (jpc_bitstream_putbit(outb, included) == EOF) {
					return -1;
				}
			}
			JAS_DBGLOG(10, ("included=%d ", included));
			if (!included) {
				continue;
			}
			if (!cblk->numencpasses) {
				i = 1;
				leaf = jpc_tagtree_getleaf(prc->nlibtree, cblk - prc->cblks);
				for (;;) {
					if ((ret = jpc_tagtree_encode(prc->nlibtree, leaf, i,
					  outb)) < 0) {
						return -1;
					}
					if (ret) {
						break;
					}
					++i;
				}
				assert(leaf->known_ && i == leaf->value_ + 1);
			}

			endpasses = &cblk->passes[cblk->numpasses];
			startpass = pass;
			endpass = startpass;
			while (endpass != endpasses && endpass->lyrno == lyrno){
				++endpass;
			}
			numnewpasses = endpass - startpass;
			if (jpc_putnumnewpasses(outb, numnewpasses)) {
				return -1;
			}
			JAS_DBGLOG(10, ("numnewpasses=%d ", numnewpasses));

			lastpass = endpass - 1;
			n = startpass->start;
			passcount = 1;
			maxadjust = 0;
			for (pass = startpass; pass != endpass; ++pass) {
				if (pass->term || pass == lastpass) {
					datalen = pass->end - n;
					t1 = jpc_int_firstone(datalen) + 1;
					t2 = cblk->numlenbits + jpc_floorlog2(passcount);
					adjust = JAS_MAX(t1 - t2, 0);
					maxadjust = JAS_MAX(adjust, maxadjust);
					n += datalen;
					passcount = 1;
				} else {
					++passcount;
				}
			}
			if (jpc_putcommacode(outb, maxadjust)) {
				return -1;
			}
			cblk->numlenbits += maxadjust;

			lastpass = endpass - 1;
			n = startpass->start;
			passcount = 1;
			for (pass = startpass; pass != endpass; ++pass) {
				if (pass->term || pass == lastpass) {
					datalen = pass->end - n;
					assert(jpc_int_firstone(datalen) < cblk->numlenbits +
					  jpc_floorlog2(passcount));
					if (jpc_bitstream_putbits(outb, cblk->numlenbits +
					  jpc_floorlog2(passcount), datalen) == EOF) {
						return -1;
					}
					n += datalen;
					passcount = 1;
				} else {
					++passcount;
				}
			}
		}
	}

	jpc_bitstream_outalign(outb, 0);
	jpc_bitstream_close(outb);

	if (cp->tcp.csty & JPC_COD_EPH) {
		if (!(ms = jpc_ms_create(JPC_MS_EPH))) {
			return -1;
		}
		if (jpc_putms(out, enc->cstate, ms)) {
			return -1;
		}
		jpc_ms_destroy(ms);
	}

	comp = &tile->tcmpts[compno];
	lvl = &comp->rlvls[lvlno];
	endbands = &lvl->bands[lvl->numbands];
	for (band = lvl->bands; band != endbands; ++band) {
		if (!band->data) {
			continue;
		}
		prc = &band->prcs[prcno];
		if (!prc->cblks) {
			continue;
		}
		endcblks = &prc->cblks[prc->numcblks];
		for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
			pass = cblk->curpass;

			if (!pass) {
				continue;
			}
			if (pass->lyrno != lyrno) {
				assert(pass->lyrno > lyrno);
				continue;
			}

			endpasses = &cblk->passes[cblk->numpasses];
			startpass = pass;
			endpass = startpass;
			while (endpass != endpasses && endpass->lyrno == lyrno){
				++endpass;
			}
			lastpass = endpass - 1;
			numnewpasses = endpass - startpass;

			jas_stream_seek(cblk->stream, startpass->start, SEEK_SET);
			assert(jas_stream_tell(cblk->stream) == startpass->start);
			if (jas_stream_copy(out, cblk->stream, lastpass->end -
			  startpass->start)) {
				return -1;
			}
			cblk->curpass = (endpass != endpasses) ? endpass : 0;
			cblk->numencpasses += numnewpasses;

		}
	}

	JAS_DBGLOG(10, ("encoding packet end\n"));

	return 0;
}